

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite_demovfs.c
# Opt level: O0

int demoWrite(unqlite_file *pFile,void *zBuf,unqlite_int64 iAmt,unqlite_int64 iOfst)

{
  int iVar1;
  int local_54;
  int rc;
  int nCopy;
  unqlite_int64 i;
  unqlite_int64 n;
  char *z;
  DemoFile *p;
  unqlite_int64 iOfst_local;
  unqlite_int64 iAmt_local;
  void *zBuf_local;
  unqlite_file *pFile_local;
  
  _rc = iOfst;
  i = iAmt;
  n = (unqlite_int64)zBuf;
  if (pFile[3].pMethods == (unqlite_io_methods *)0x0) {
    pFile_local._4_4_ = demoDirectWrite((DemoFile *)pFile,zBuf,(int)iAmt,iOfst);
  }
  else {
    for (; 0 < i; i = i - local_54) {
      if (((*(int *)&pFile[4].pMethods == 0x2000) ||
          ((long)&(pFile[5].pMethods)->iVersion + (long)*(int *)&pFile[4].pMethods != _rc)) &&
         (iVar1 = demoFlushBuffer((DemoFile *)pFile), iVar1 != 0)) {
        return iVar1;
      }
      if ((*(int *)&pFile[4].pMethods != 0) &&
         ((long)&(pFile[5].pMethods)->iVersion + (long)*(int *)&pFile[4].pMethods != _rc)) {
        __assert_fail("p->nBuffer==0 || p->iBufferOfst+p->nBuffer==i",
                      "/workspace/llm4binary/github/license_c_cmakelists/symisc[P]unqlite/example/demovfs/unqlite_demovfs.c"
                      ,0x121,
                      "int demoWrite(unqlite_file *, const void *, unqlite_int64, unqlite_int64)");
      }
      pFile[5].pMethods = (unqlite_io_methods *)(_rc - *(int *)&pFile[4].pMethods);
      local_54 = 0x2000 - *(int *)&pFile[4].pMethods;
      if (i < local_54) {
        local_54 = (int)i;
      }
      memcpy((void *)((long)&(pFile[3].pMethods)->iVersion + (long)*(int *)&pFile[4].pMethods),
             (void *)n,(long)local_54);
      *(int *)&pFile[4].pMethods = local_54 + *(int *)&pFile[4].pMethods;
      _rc = local_54 + _rc;
      n = n + local_54;
    }
    pFile_local._4_4_ = 0;
  }
  return pFile_local._4_4_;
}

Assistant:

static int demoWrite(
  unqlite_file *pFile, 
  const void *zBuf,
#if defined(_MSC_VER) || defined(__MINGW32__)
  int iAmt,
#else
  unqlite_int64 iAmt,
#endif /* defined(_MSC_VER) || defined(__MINGW32__) */
  unqlite_int64 iOfst
){
  DemoFile *p = (DemoFile*)pFile;
  
  if( p->aBuffer ){
    char *z = (char *)zBuf;       /* Pointer to remaining data to write */
#if defined(_MSC_VER) || defined(__MINGW32__)
    int n = iAmt;                  /* Number of bytes at z */
#else
    unqlite_int64 n = iAmt;       /* Number of bytes at z */
#endif /* defined(_MSC_VER) || defined(__MINGW32__) */
    unqlite_int64 i = iOfst;      /* File offset to write to */

    while( n>0 ){
      int nCopy;                  /* Number of bytes to copy into buffer */

      /* If the buffer is full, or if this data is not being written directly
      ** following the data already buffered, flush the buffer. Flushing
      ** the buffer is a no-op if it is empty.  
      */
      if( p->nBuffer==UNQLITE_DEMOVFS_BUFFERSZ || p->iBufferOfst+p->nBuffer!=i ){
        int rc = demoFlushBuffer(p);
        if( rc!=UNQLITE_OK ){
          return rc;
        }
      }
      assert( p->nBuffer==0 || p->iBufferOfst+p->nBuffer==i );
      p->iBufferOfst = i - p->nBuffer;

      /* Copy as much data as possible into the buffer. */
      nCopy = UNQLITE_DEMOVFS_BUFFERSZ - p->nBuffer;
      if( nCopy>n ){
        nCopy = n;
      }
      memcpy(&p->aBuffer[p->nBuffer], z, nCopy);
      p->nBuffer += nCopy;

      n -= nCopy;
      i += nCopy;
      z += nCopy;
    }
  }else{
    return demoDirectWrite(p, zBuf, iAmt, iOfst);
  }

  return UNQLITE_OK;
}